

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbglxintegration.cpp
# Opt level: O0

QOpenGLContext * __thiscall
QXcbGlxIntegration::createOpenGLContext
          (QXcbGlxIntegration *this,GLXContext glxContext,void *visualInfo,
          QOpenGLContext *shareContext)

{
  QOpenGLContextPrivate *pQVar1;
  GLXContext in_RCX;
  Display *in_RDX;
  QGLXContext *in_RSI;
  long in_RDI;
  Display *display;
  QOpenGLContextPrivate *contextPrivate;
  QOpenGLContext *context;
  QPlatformOpenGLContext *shareHandle;
  undefined8 local_58;
  undefined8 local_8;
  
  if (in_RSI == (QGLXContext *)0x0) {
    local_8 = (QOpenGLContext *)0x0;
  }
  else {
    if (in_RCX == (GLXContext)0x0) {
      local_58 = (void *)0x0;
    }
    else {
      local_58 = (void *)QOpenGLContext::handle();
    }
    local_8 = (QOpenGLContext *)operator_new(0x10);
    QOpenGLContext::QOpenGLContext(local_8,(QObject *)0x0);
    pQVar1 = QOpenGLContextPrivate::get(local_8);
    QXcbBasicConnection::xlib_display(*(QXcbBasicConnection **)(in_RDI + 0x10));
    operator_new(0x58);
    QGLXContext::QGLXContext(in_RSI,in_RDX,in_RCX,local_58,(QPlatformOpenGLContext *)local_8);
    QOpenGLContextPrivate::adopt((QPlatformOpenGLContext *)pQVar1);
  }
  return local_8;
}

Assistant:

QOpenGLContext *QXcbGlxIntegration::createOpenGLContext(GLXContext glxContext, void *visualInfo, QOpenGLContext *shareContext) const
{
    if (!glxContext)
        return nullptr;

    QPlatformOpenGLContext *shareHandle = shareContext ? shareContext->handle() : nullptr;

    auto *context = new QOpenGLContext;
    auto *contextPrivate = QOpenGLContextPrivate::get(context);
    auto *display = static_cast<Display *>(m_connection->xlib_display());
    contextPrivate->adopt(new QGLXContext(display, glxContext, visualInfo, shareHandle));
    return context;
}